

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_dump.cpp
# Opt level: O3

void __thiscall hex_dump::dump(hex_dump *this,interface *config,uint8_t *begin,size_t size)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  uint8_t *puVar4;
  long lVar5;
  uint8_t *puVar6;
  byte bVar7;
  long lVar8;
  bool bVar9;
  char local_55;
  char local_54 [3];
  char local_51;
  long local_50;
  interface *local_48;
  uint8_t *local_40;
  size_t local_38;
  
  local_48 = config;
  line_header(this,config);
  puVar4 = begin;
  if (size != 0) {
    while( true ) {
      local_50 = size - 1;
      lVar2 = -0xf;
      lVar1 = 0;
      local_38 = size;
      do {
        lVar8 = lVar1;
        lVar5 = lVar2;
        bVar7 = puVar4[lVar8];
        local_55 = (bVar7 >> 4) + 0x57;
        if (bVar7 < 0xa0) {
          local_55 = (bVar7 >> 4) + 0x30;
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(this->output_,&local_55,1);
        bVar7 = bVar7 & 0xf;
        local_54[0] = bVar7 + 0x57;
        if (bVar7 < 10) {
          local_54[0] = bVar7 + 0x30;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_54,1);
        local_54[1] = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(this->output_,local_54 + 1,1);
        lVar1 = lVar8 + 1;
      } while ((local_50 != lVar8) && (lVar2 = lVar5 + 1, lVar8 != 0xf));
      if (lVar8 != 0xf) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(this->output_,"   ",3);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0);
      }
      local_40 = puVar4 + lVar1;
      if (local_40 != begin) {
        puVar6 = begin;
        do {
          local_54[2] = *puVar6;
          if (0x5e < (byte)(*puVar6 - 0x20)) {
            local_54[2] = '.';
          }
          std::__ostream_insert<char,std::char_traits<char>>(this->output_,local_54 + 2,1);
          begin = puVar6 + 1;
          bVar9 = puVar6 != puVar4 + lVar8;
          puVar6 = begin;
        } while (bVar9);
      }
      local_51 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(this->output_,&local_51,1);
      if (local_50 == lVar8) break;
      size = local_38 - lVar1;
      line_header(this,local_48);
      puVar4 = local_40;
    }
  }
  return;
}

Assistant:

void hex_dump::dump( const interface& config, const std::uint8_t* begin, std::size_t size )
{
    static const std::size_t page_width = 16;
    std::size_t              char_cnt   = page_width;
    const std::uint8_t*      line_start = begin;

    line_header( config );

    while ( size )
    {
        print_hex( output_, *begin );
        output_ << ' ';

        --size;
        ++begin;
        --char_cnt;

        if ( char_cnt == 0 || size == 0 )
        {
            // fill rest of the line
            for ( ; char_cnt != 0; --char_cnt)
                output_ << "   ";

            for ( ; line_start != begin; ++line_start )
                output_ << as_printable( *line_start );

            output_ << '\n';

            if ( size )
                line_header( config );

            char_cnt   = page_width;
        }
    }
}